

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

void Dch_DeriveChoiceAigNode
               (Aig_Man_t *pAigNew,Aig_Man_t *pAigOld,Aig_Obj_t *pObj,int fSkipRedSupps)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *p1;
  Aig_Obj_t *local_40;
  Aig_Obj_t *pReprNew;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pRepr;
  int fSkipRedSupps_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *pAigOld_local;
  Aig_Man_t *pAigNew_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                  ,0x1be,"void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)")
    ;
  }
  pAVar2 = Aig_ObjRepr(pAigOld,pObj);
  if ((pAVar2 == (Aig_Obj_t *)0x0) ||
     ((iVar1 = Aig_ObjIsConst1(pAVar2), iVar1 == 0 && (iVar1 = Aig_ObjIsCi(pAVar2), iVar1 == 0)))) {
    pAVar3 = Aig_ObjChild0CopyRepr(pAigNew,pObj);
    p1 = Aig_ObjChild1CopyRepr(pAigNew,pObj);
    pAVar3 = Aig_And(pAigNew,pAVar3,p1);
    pAVar3 = Aig_ObjGetRepr(pAigNew,pAVar3);
    if ((pObj->field_5).pData != (void *)0x0) {
      __assert_fail("pObj->pData == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                    ,0x1ce,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
    (pObj->field_5).pData = pAVar3;
    if (pAVar2 != (Aig_Obj_t *)0x0) {
      if (pObj->Id <= pAVar2->Id) {
        __assert_fail("pRepr->Id < pObj->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                      ,0x1d3,
                      "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
      }
      iVar1 = Aig_ObjIsNode(pAVar2);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pRepr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                      ,0x1d4,
                      "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
      }
      pAVar3 = Aig_Regular((Aig_Obj_t *)(pObj->field_5).pData);
      local_40 = Aig_Regular((Aig_Obj_t *)(pAVar2->field_5).pData);
      if (local_40->Id < pAVar3->Id) {
        if (pAVar3->Id <= local_40->Id) {
          __assert_fail("pReprNew->Id < pObjNew->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                        ,0x1db,
                        "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
        }
        Aig_ObjSetRepr(pAigNew,pAVar3,local_40);
        if ((*(ulong *)&pAVar3->field_0x18 >> 6 & 0x3ffffff) == 0) {
          if ((*(ulong *)&pAVar3->field_0x18 >> 6 & 0x3ffffff) != 0) {
            __assert_fail("pObjNew->nRefs == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                          ,0x1e1,
                          "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)"
                         );
          }
          iVar1 = Dch_ObjCheckTfi(pAigNew,pAVar3,local_40);
          if ((iVar1 == 0) &&
             ((fSkipRedSupps == 0 ||
              (iVar1 = Dch_ObjCheckSuppRed(pAigNew,pAVar3,local_40), iVar1 == 0)))) {
            while (pAigNew->pEquivs[local_40->Id] != (Aig_Obj_t *)0x0) {
              local_40 = pAigNew->pEquivs[local_40->Id];
            }
            if (pAigNew->pEquivs[local_40->Id] != (Aig_Obj_t *)0x0) {
              __assert_fail("pAigNew->pEquivs[pReprNew->Id] == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                            ,0x1eb,
                            "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)"
                           );
            }
            pAigNew->pEquivs[local_40->Id] = pAVar3;
          }
        }
      }
    }
  }
  else {
    if ((pAVar2->field_5).pData == (void *)0x0) {
      __assert_fail("pRepr->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                    ,0x1c3,
                    "void Dch_DeriveChoiceAigNode(Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, int)");
    }
    pAVar2 = Aig_NotCond((Aig_Obj_t *)(pAVar2->field_5).pData,
                         (uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1 ^
                         (uint)(*(ulong *)&pAVar2->field_0x18 >> 3) & 1);
    (pObj->field_5).pData = pAVar2;
  }
  return;
}

Assistant:

void Dch_DeriveChoiceAigNode( Aig_Man_t * pAigNew, Aig_Man_t * pAigOld, Aig_Obj_t * pObj, int fSkipRedSupps )
{
    Aig_Obj_t * pRepr, * pObjNew, * pReprNew;
    assert( !Aig_IsComplement(pObj) );
    // get the representative
    pRepr = Aig_ObjRepr( pAigOld, pObj );
    if ( pRepr != NULL && (Aig_ObjIsConst1(pRepr) || Aig_ObjIsCi(pRepr)) )
    {
        assert( pRepr->pData != NULL );
        pObj->pData = Aig_NotCond( (Aig_Obj_t *)pRepr->pData, pObj->fPhase ^ pRepr->fPhase );
        return;
    }
    // get the new node
    pObjNew = Aig_And( pAigNew, 
        Aig_ObjChild0CopyRepr(pAigNew, pObj), 
        Aig_ObjChild1CopyRepr(pAigNew, pObj) );
    pObjNew = Aig_ObjGetRepr( pAigNew, pObjNew );
//    assert( Aig_ObjRepr( pAigNew, pObjNew ) == NULL );
    // assign the copy
    assert( pObj->pData == NULL );
    pObj->pData = pObjNew;
    // skip those without reprs
    if ( pRepr == NULL )
        return;
    assert( pRepr->Id < pObj->Id );
    assert( Aig_ObjIsNode(pRepr) );
    // get the corresponding new nodes
    pObjNew  = Aig_Regular((Aig_Obj_t *)pObj->pData);
    pReprNew = Aig_Regular((Aig_Obj_t *)pRepr->pData);
    // skip earlier nodes
    if ( pReprNew->Id >= pObjNew->Id )
        return;
    assert( pReprNew->Id < pObjNew->Id );
    // set the representatives
    Aig_ObjSetRepr( pAigNew, pObjNew, pReprNew );
    // skip used nodes
    if ( pObjNew->nRefs > 0 )
        return;
    assert( pObjNew->nRefs == 0 );
    // skip choices that can lead to combo loops
    if ( Dch_ObjCheckTfi( pAigNew, pObjNew, pReprNew ) )
        return;
    // don't add choice if structural support of pObjNew and pReprNew differ
    if ( fSkipRedSupps && Dch_ObjCheckSuppRed(pAigNew, pObjNew, pReprNew) )
        return;
    // add choice to the end of the list
    while ( pAigNew->pEquivs[pReprNew->Id] != NULL )
        pReprNew = pAigNew->pEquivs[pReprNew->Id];
    assert( pAigNew->pEquivs[pReprNew->Id] == NULL );
    pAigNew->pEquivs[pReprNew->Id] = pObjNew;
}